

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_io_task_perform(void *uuid_,void *args_)

{
  fio_defer_task_s task;
  fio_protocol_s *pfVar1;
  int *piVar2;
  fio_lock_i ret;
  
  pfVar1 = fio_protocol_try_lock((intptr_t)uuid_,*args_);
  if (pfVar1 == (fio_protocol_s *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 != 9) {
      task.arg1 = uuid_;
      task.func = fio_io_task_perform;
      task.arg2 = args_;
      fio_defer_push_task_fn(task,&task_queue_normal);
      return;
    }
    if (*(code **)((long)args_ + 0x18) != (code *)0x0) {
      (**(code **)((long)args_ + 0x18))(uuid_,*(undefined8 *)((long)args_ + 0x10));
    }
  }
  else {
    (**(code **)((long)args_ + 8))(uuid_,pfVar1,*(undefined8 *)((long)args_ + 0x10));
    LOCK();
    *(undefined1 *)((long)&pfVar1->rsv + (ulong)*args_) = 0;
    UNLOCK();
  }
  fio_free(args_);
  return;
}

Assistant:

static void fio_io_task_perform(void *uuid_, void *args_) {
  fio_defer_iotask_args_s *args = args_;
  intptr_t uuid = (intptr_t)uuid_;
  fio_protocol_s *pr = fio_protocol_try_lock(uuid, args->type);
  if (!pr)
    goto postpone;
  args->task(uuid, pr, args->udata);
  fio_protocol_unlock(pr, args->type);
  fio_free(args);
  return;
postpone:
  if (errno == EBADF) {
    if (args->fallback)
      args->fallback(uuid, args->udata);
    fio_free(args);
    return;
  }
  fio_defer_push_task(fio_io_task_perform, uuid_, args_);
}